

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

void crnlib::LzmaEncProps_Normalize(CLzmaEncProps *p)

{
  int iVar1;
  UInt32 UVar2;
  
  iVar1 = 5;
  if (-1 < p->level) {
    iVar1 = p->level;
  }
  p->level = iVar1;
  if (p->dictSize == 0) {
    if (iVar1 < 6) {
      UVar2 = 1 << ((char)iVar1 * '\x02' + 0xeU & 0x1f);
    }
    else {
      UVar2 = (uint)(iVar1 != 6) * 0x2000000 + 0x2000000;
    }
    p->dictSize = UVar2;
  }
  if (p->lc < 0) {
    p->lc = 3;
  }
  if (p->lp < 0) {
    p->lp = 0;
  }
  if (p->pb < 0) {
    p->pb = 2;
  }
  if (p->algo < 0) {
    p->algo = (uint)(4 < iVar1);
  }
  if (p->fb < 0) {
    p->fb = (uint)(6 < iVar1) * 0x20 + 0x20;
  }
  if (p->btMode < 0) {
    p->btMode = (uint)(p->algo != 0);
  }
  if (p->numHashBytes < 0) {
    p->numHashBytes = 4;
  }
  if (p->mc == 0) {
    p->mc = (p->fb >> 1) + 0x10 >> (p->btMode == 0);
  }
  if (-1 < p->numThreads) {
    return;
  }
  if (p->btMode == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 2 - (uint)(p->algo == 0);
  }
  p->numThreads = iVar1;
  return;
}

Assistant:

void LzmaEncProps_Normalize(CLzmaEncProps* p) {
  int level = p->level;
  if (level < 0)
    level = 5;
  p->level = level;
  if (p->dictSize == 0)
    p->dictSize = (level <= 5 ? (1 << (level * 2 + 14)) : (level == 6 ? (1 << 25) : (1 << 26)));
  if (p->lc < 0)
    p->lc = 3;
  if (p->lp < 0)
    p->lp = 0;
  if (p->pb < 0)
    p->pb = 2;
  if (p->algo < 0)
    p->algo = (level < 5 ? 0 : 1);
  if (p->fb < 0)
    p->fb = (level < 7 ? 32 : 64);
  if (p->btMode < 0)
    p->btMode = (p->algo == 0 ? 0 : 1);
  if (p->numHashBytes < 0)
    p->numHashBytes = 4;
  if (p->mc == 0)
    p->mc = (16 + (p->fb >> 1)) >> (p->btMode ? 0 : 1);
  if (p->numThreads < 0)
    p->numThreads = ((p->btMode && p->algo) ? 2 : 1);
}